

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_LogEscapeMessage::test_method(test_LogEscapeMessage *this)

{
  long lVar1;
  undefined1 **ppuVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  undefined1 local_78 [32];
  string NUL;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a0 = "";
  ppuVar2 = &local_b8;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x5d0;
  file.m_begin = (iterator)&local_a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar2,msg);
  NUL._M_string_length = NUL._M_string_length & 0xffffffffffffff00;
  NUL._M_dataplus._M_p = "<W\x1b";
  NUL.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  NUL.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c0 = "";
  str._M_str = (char *)ppuVar2;
  str._M_len = (size_t)anon_var_dwarf_140bec5;
  BCLog::LogEscapeMessage_abi_cxx11_((string *)local_78,(BCLog *)0x14,str);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (&NUL,&local_c8,0x5d0,1,2,pvVar4,anon_var_dwarf_140bed2,anon_var_dwarf_140bec5,
             anon_var_dwarf_140bedf);
  std::__cxx11::string::~string((string *)local_78);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d0 = "";
  ppuVar2 = &local_e8;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x5d2;
  file_00.m_begin = (iterator)&local_d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar2,msg_00);
  NUL._M_string_length = NUL._M_string_length & 0xffffffffffffff00;
  NUL._M_dataplus._M_p = "<W\x1b";
  NUL.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  NUL.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_f0 = "";
  str_00._M_str = (char *)ppuVar2;
  str_00._M_len = (size_t)"Message\n with newlines\n";
  BCLog::LogEscapeMessage_abi_cxx11_((string *)local_78,(BCLog *)0x17,str_00);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
            (&NUL,&local_f8,0x5d2,1,2,pvVar4,
             "BCLog::LogEscapeMessage(\"Message\\n with newlines\\n\")","Message\n with newlines\n",
             "\"Message\\n with newlines\\n\"");
  std::__cxx11::string::~string((string *)local_78);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  ppuVar2 = &local_118;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x5d4;
  file_01.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar2,msg_01);
  NUL._M_string_length = NUL._M_string_length & 0xffffffffffffff00;
  NUL._M_dataplus._M_p = "<W\x1b";
  NUL.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  NUL.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_120 = "";
  str_01._M_str = (char *)ppuVar2;
  str_01._M_len = (size_t)"\x01\x7f Corrupted log message\r";
  BCLog::LogEscapeMessage_abi_cxx11_((string *)local_78,(BCLog *)0x19,str_01);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
            (&NUL,&local_128,0x5d4,1,2,pvVar4,
             "BCLog::LogEscapeMessage(\"\\x01\\x7f Corrupted log message\\x0d\")",
             "\\x01\\x7f Corrupted log message\\x0d","R\"(\\x01\\x7f Corrupted log message\\x0d)\"")
  ;
  std::__cxx11::string::~string((string *)local_78);
  NUL._M_dataplus._M_p = (pointer)&NUL.field_2;
  NUL.field_2._M_allocated_capacity._0_4_ = 0x4f004f;
  NUL._M_string_length = 3;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_130 = "";
  ppuVar2 = &local_148;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x5d7;
  file_02.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar2,msg_02);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_150 = "";
  str_02._M_str = (char *)ppuVar2;
  str_02._M_len = (size_t)NUL._M_dataplus._M_p;
  BCLog::LogEscapeMessage_abi_cxx11_(&local_98,(BCLog *)NUL._M_string_length,str_02);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_78,&local_158,0x5d7,1,2,&local_98,"BCLog::LogEscapeMessage(NUL)","O\\x00O",
             "R\"(O\\x00O)\"");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&NUL);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LogEscapeMessage)
{
    // ASCII and UTF-8 must pass through unaltered.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("Valid log message貓"), "Valid log message貓");
    // Newlines must pass through unaltered.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("Message\n with newlines\n"), "Message\n with newlines\n");
    // Other control characters are escaped in C syntax.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("\x01\x7f Corrupted log message\x0d"), R"(\x01\x7f Corrupted log message\x0d)");
    // Embedded NULL characters are escaped too.
    const std::string NUL("O\x00O", 3);
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage(NUL), R"(O\x00O)");
}